

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
viennamath::expression_not_evaluable_exception::expression_not_evaluable_exception
          (expression_not_evaluable_exception *this,string *str)

{
  string *str_local;
  expression_not_evaluable_exception *this_local;
  
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__expression_not_evaluable_exception_00148fc8;
  std::__cxx11::string::string((string *)&this->message_,(string *)str);
  return;
}

Assistant:

expression_not_evaluable_exception(std::string const & str) : message_(str) {}